

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ts_parser__recover(TSParser *self,StackVersion version,Subtree lookahead)

{
  uint uVar1;
  uint uVar2;
  StackSummaryEntry *pSVar3;
  SubtreeHeapData *pSVar4;
  Subtree self_00;
  TSLanguage *self_01;
  StackSliceArray SVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  _Bool _Var8;
  ushort uVar9;
  TSSymbol TVar10;
  undefined4 extraout_var;
  StackSlice *extraout_RAX;
  MutableSubtree MVar11;
  StackHead *pSVar12;
  Subtree *pSVar13;
  MutableSubtree extraout_RAX_00;
  Subtree SVar14;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  _func_uint32_t_TSLexer_ptr *p_Var23;
  StackSummary *pSVar24;
  TSParser *pool;
  TSStateId TVar25;
  TSParser *unaff_RBP;
  StackVersion SVar26;
  StackSlice *pSVar27;
  _func_uint32_t_TSLexer_ptr *p_Var28;
  Stack *pSVar29;
  TSParser *self_02;
  TSParser *self_03;
  TSParser *pTVar30;
  ulong uVar31;
  TSParser *unaff_R14;
  long lVar32;
  MutableSubtree unaff_R15;
  bool bVar33;
  Length LVar34;
  SubtreeArray SVar35;
  StackSliceArray SVar36;
  StackSliceArray SVar37;
  SubtreeArray children;
  char *contents;
  Length result;
  Length result_1;
  ulong uStack_1b0;
  TableEntry TStack_178;
  TSParser *pTStack_168;
  TSParser *pTStack_160;
  TSParser *pTStack_158;
  TSParser *pTStack_150;
  MutableSubtree MStack_148;
  TSParser *pTStack_140;
  Subtree local_138;
  undefined4 local_12c;
  undefined1 local_128 [72];
  MutableSubtree local_e0;
  uint local_d4;
  SubtreePool *local_d0;
  ulong local_c8;
  uint local_c0;
  uint local_bc;
  uint32_t local_b8;
  uint local_b4;
  long local_b0;
  StackSlice *local_a8;
  SubtreeArray local_a0;
  char *local_90;
  _func_void_void_ptr_TSLogType_char_ptr *local_88;
  TSParser *local_80;
  ulong local_78;
  StackSlice *pSVar15;
  
  pTVar30 = (TSParser *)(ulong)version;
  local_128._24_8_ = ZEXT48((self->stack->heads).size);
  pTStack_140 = (TSParser *)0x13707f;
  local_138 = lookahead;
  LVar34 = ts_stack_position(self->stack,version);
  local_c8 = LVar34._0_8_;
  pSVar29 = self->stack;
  if ((pSVar29->heads).size <= version) {
    pTStack_140 = (TSParser *)0x137c48;
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x240,"StackSummary *ts_stack_get_summary(Stack *, StackVersion)");
  }
  local_b0 = (long)pTVar30 * 5;
  pSVar24 = (pSVar29->heads).contents[(long)pTVar30].summary;
  pTStack_140 = (TSParser *)0x1370b5;
  local_d4 = ts_stack_node_count_since_error(pSVar29,version);
  pTStack_140 = (TSParser *)0x1370c9;
  uVar1 = ts_stack_error_cost(self->stack,version);
  local_128._40_8_ = CONCAT44(extraout_var,uVar1);
  p_Var28 = (_func_uint32_t_TSLexer_ptr *)local_128._24_8_;
  local_128._32_4_ = version;
  local_128._48_8_ = self;
  if (pSVar24 == (StackSummary *)0x0) {
    local_12c = 0;
  }
  else if (((((ulong)local_138.ptr & 1) == 0) && ((local_138.ptr)->symbol == 0xffff)) ||
          (pSVar24->size == 0)) {
    local_12c = 0;
  }
  else {
    local_c0 = (uint)(local_d4 != 0);
    local_88 = (_func_void_void_ptr_TSLogType_char_ptr *)(local_c8 >> 0x20);
    local_b8 = uVar1 + (int)local_c8;
    local_bc = (uint)local_138.data.symbol;
    local_d0 = &self->tree_pool;
    local_90 = (self->lexer).debug_buffer;
    unaff_R15.ptr = (SubtreeHeapData *)0x0;
    local_12c = 0;
    local_128._64_8_ = pSVar24;
    do {
      uVar7 = local_128._32_4_;
      pSVar3 = pSVar24->contents;
      uVar9 = pSVar3[(long)unaff_R15].state;
      unaff_RBP = (TSParser *)(ulong)uVar9;
      bVar33 = false;
      if (uVar9 != 0) {
        uVar1 = pSVar3[(long)unaff_R15].position.bytes;
        unaff_R14 = (TSParser *)(ulong)uVar1;
        if (uVar1 != (uint)local_c8) {
          uVar17 = pSVar3[(long)unaff_R15].position.extent.row;
          local_128._36_4_ = pSVar3[(long)unaff_R15].depth;
          local_e0 = unaff_R15;
          if ((int)p_Var28 != 0) {
            p_Var23 = (_func_uint32_t_TSLexer_ptr *)0x0;
            do {
              pSVar29 = self->stack;
              if ((_func_uint32_t_TSLexer_ptr *)(ulong)(pSVar29->heads).size <= p_Var23)
              goto LAB_00137beb;
              if (((pSVar29->heads).contents[(long)p_Var23].node)->state == uVar9) {
                pTStack_140 = (TSParser *)0x1371d7;
                LVar34 = ts_stack_position(pSVar29,(StackVersion)p_Var23);
                p_Var28 = (_func_uint32_t_TSLexer_ptr *)local_128._24_8_;
                if (LVar34.bytes == (uint)local_c8) {
                  bVar33 = false;
                  pSVar24 = (StackSummary *)local_128._64_8_;
                  unaff_R15 = local_e0;
                  goto LAB_001375dd;
                }
              }
              p_Var23 = p_Var23 + 1;
            } while (p_Var23 != p_Var28);
          }
          uVar16 = ((int)local_88 - uVar17) * 0x1e;
          pTStack_140 = (TSParser *)0x13721f;
          _Var8 = ts_parser__better_version_exists
                            (self,uVar7,
                             (_Bool)(((char)local_b8 - (char)uVar1) + (char)local_128._36_4_ * 'd' +
                                    (char)uVar16),uVar16);
          unaff_R15 = local_e0;
          pSVar24 = (StackSummary *)local_128._64_8_;
          bVar33 = true;
          p_Var28 = (_func_uint32_t_TSLexer_ptr *)local_128._24_8_;
          if (!_Var8) {
            TVar10 = (TSSymbol)local_bc;
            if (((ulong)local_138.ptr & 1) == 0) {
              TVar10 = (local_138.ptr)->symbol;
            }
            pTStack_140 = (TSParser *)0x13726f;
            ts_language_table_entry(self->language,uVar9,TVar10,(TableEntry *)local_128);
            if (local_128._8_4_ != 0) {
              local_128._36_4_ = local_128._36_4_ + local_c0;
              pTStack_140 = (TSParser *)0x137296;
              SVar36 = ts_stack_pop_count(self->stack,uVar7,local_128._36_4_);
              self = (TSParser *)local_128._48_8_;
              if (SVar36.size != 0) {
                uVar21 = 0;
                local_128._60_4_ = 0xffffffff;
                local_b4 = (uint)uVar9;
                SVar5 = SVar36;
                do {
                  pTVar30 = SVar5._8_8_;
                  local_a8 = SVar5.contents;
                  pSVar15 = SVar36.contents;
                  local_128._16_8_ = *(undefined8 *)&pSVar15[uVar21].version;
                  local_128._0_8_ = pSVar15[uVar21].subtrees.contents;
                  local_128._8_8_ = *(undefined8 *)&pSVar15[uVar21].subtrees.size;
                  uVar16 = (uint)local_128._16_8_;
                  uVar1 = (uint)uVar21;
                  if (uVar16 == local_128._60_4_) {
                    pTStack_140 = (TSParser *)0x1372fe;
                    ts_subtree_array_delete(local_d0,(SubtreeArray *)local_128);
                    pSVar27 = pSVar15 + (uVar1 + 1);
                    unaff_RBP = (TSParser *)(ulong)local_b4;
LAB_00137472:
                    pTStack_140 = (TSParser *)0x137487;
                    memmove(pSVar15 + uVar21,pSVar27,(ulong)(SVar36.size + ~uVar1) * 0x18);
                    unaff_R14 = (TSParser *)
                                ((long)&pTVar30[0x2c47f4].token_cache.last_external_token.ptr + 7);
                  }
                  else {
                    pSVar29 = *(Stack **)(local_128._48_8_ + 0x4a8);
                    if ((pSVar29->heads).size <= uVar16) {
LAB_00137beb:
                      pTStack_140 = (TSParser *)0x137c0a;
                      __assert_fail("(uint32_t)version < (&self->heads)->size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                    ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
                    }
                    pSVar12 = (pSVar29->heads).contents;
                    TVar25 = (TSStateId)unaff_RBP;
                    if ((pSVar12[local_128._16_8_ & 0xffffffff].node)->state != TVar25) {
                      pSVar12[local_128._16_8_ & 0xffffffff].status = StackStatusHalted;
                      pTStack_140 = (TSParser *)0x13745a;
                      ts_subtree_array_delete(local_d0,(SubtreeArray *)local_128);
                      pSVar27 = local_a8 + (uVar1 + 1);
                      pSVar15 = local_a8;
                      goto LAB_00137472;
                    }
                    pTStack_140 = (TSParser *)0x13735b;
                    local_a0 = ts_stack_pop_error(pSVar29,uVar16);
                    if (local_a0.size != 0) {
                      if (local_a0.size != 1) {
                        pTStack_140 = (TSParser *)0x137c29;
                        __assert_fail("error_trees.size == 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                                      ,0x40e,
                                      "_Bool ts_parser__recover_to_state(TSParser *, StackVersion, unsigned int, TSStateId)"
                                     );
                      }
                      pSVar4 = (local_a0.contents)->ptr;
                      uVar1 = 0;
                      if (((ulong)pSVar4 & 1) == 0) {
                        uVar1 = pSVar4->child_count;
                      }
                      if (uVar1 != 0) {
                        pTStack_140 = (TSParser *)0x1373a8;
                        array__splice((VoidArray *)local_128,8,0,0,uVar1,
                                      (pSVar4->field_17).field_0.children);
                        uVar6 = local_128._0_8_;
                        uVar22 = 0;
                        do {
                          pTStack_140 = (TSParser *)0x1373bc;
                          ts_subtree_retain(*(Subtree *)(uVar6 + uVar22 * 8));
                          uVar22 = uVar22 + 1;
                        } while (uVar1 != uVar22);
                      }
                      pTStack_140 = (TSParser *)0x1373d6;
                      ts_subtree_array_delete(local_d0,&local_a0);
                    }
                    pTStack_140 = (TSParser *)0x1373e6;
                    SVar35 = ts_subtree_array_remove_trailing_extras((SubtreeArray *)local_128);
                    uVar6 = local_128._48_8_;
                    local_80 = pTVar30;
                    local_78 = uVar21;
                    if (local_128._8_4_ == 0) {
                      pTStack_140 = (TSParser *)0x13749b;
                      free((void *)local_128._0_8_);
                      local_128._0_8_ = (Subtree *)0x0;
                      local_128._8_8_ = (_func_void_TSLexer_ptr__Bool *)0x0;
                    }
                    else {
                      pTStack_140 = (TSParser *)0x137427;
                      MVar11 = ts_subtree_new_node(local_d0,0xffff,(SubtreeArray *)local_128,0,
                                                   *(TSLanguage **)(local_128._48_8_ + 0x4d0));
                      (MVar11.ptr)->field_0x2c = (MVar11.ptr)->field_0x2c | 4;
                      pTStack_140 = (TSParser *)0x137443;
                      ts_stack_push(*(Stack **)(uVar6 + 0x4a8),local_128._16_4_,(Subtree)MVar11,
                                    false,TVar25);
                    }
                    uVar6 = local_128._48_8_;
                    if (((undefined1  [16])SVar35 & (undefined1  [16])0xffffffff) !=
                        (undefined1  [16])0x0) {
                      uVar7 = local_128._16_4_;
                      uVar21 = 0;
                      do {
                        pTStack_140 = (TSParser *)0x1374d1;
                        ts_stack_push(*(Stack **)(uVar6 + 0x4a8),uVar7,SVar35.contents[uVar21],false
                                      ,TVar25);
                        uVar21 = uVar21 + 1;
                      } while ((SVar35._8_8_ & 0xffffffff) != uVar21);
                    }
                    local_128._60_4_ = local_128._16_4_;
                    pTStack_140 = (TSParser *)0x1374e9;
                    free(SVar35.contents);
                    uVar21 = (ulong)((int)local_78 + 1);
                    unaff_R14 = local_80;
                  }
                  unaff_R15 = local_e0;
                  pSVar24 = (StackSummary *)local_128._64_8_;
                  self = (TSParser *)local_128._48_8_;
                  SVar5._8_8_ = unaff_R14;
                  SVar5.contents = local_a8;
                  SVar36.size = (int)((ulong)unaff_R14 & 0xffffffff);
                  SVar36.capacity = (int)(((ulong)unaff_R14 & 0xffffffff) >> 0x20);
                  SVar36.contents = local_a8;
                } while ((uint)uVar21 < (uint)unaff_R14);
                if (local_128._60_4_ == 0xffffffff) {
                  bVar33 = false;
                  p_Var28 = (_func_uint32_t_TSLexer_ptr *)local_128._24_8_;
                }
                else {
                  if (((((Lexer *)local_128._48_8_)->logger).log !=
                       (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                     (pSVar15 = local_a8, *(FILE **)(local_128._48_8_ + 0x588) != (FILE *)0x0)) {
                    pTStack_140 = (TSParser *)0x13756c;
                    snprintf(local_90,0x400,"recover_to_previous state:%u, depth:%u",unaff_RBP,
                             (ulong)(uint)local_128._36_4_);
                    pTStack_140 = (TSParser *)0x137574;
                    ts_parser__log(self);
                    pSVar15 = extraout_RAX;
                  }
                  local_12c = (undefined4)CONCAT71((int7)((ulong)pSVar15 >> 8),1);
                  if (*(FILE **)((long)self + 0x588) != (FILE *)0x0) {
                    pTStack_140 = (TSParser *)0x13759c;
                    ts_stack_print_dot_graph
                              (*(Stack **)((long)self + 0x4a8),*(TSLanguage **)((long)self + 0x4d0),
                               *(FILE **)((long)self + 0x588));
                    pTStack_140 = (TSParser *)0x1375b0;
                    fputs("\n\n",*(FILE **)((long)self + 0x588));
                  }
                  bVar33 = true;
                  p_Var28 = (_func_uint32_t_TSLexer_ptr *)local_128._24_8_;
                }
                goto LAB_001375dd;
              }
            }
            bVar33 = false;
            p_Var28 = (_func_uint32_t_TSLexer_ptr *)local_128._24_8_;
          }
        }
      }
LAB_001375dd:
    } while ((!bVar33) &&
            (unaff_R15.ptr = (SubtreeHeapData *)((long)&(unaff_R15.ptr)->ref_count + 1),
            unaff_R15.ptr < (SubtreeHeapData *)(ulong)pSVar24->size));
    pTVar30 = (TSParser *)(ulong)(uint)local_128._32_4_;
  }
  while( true ) {
    pSVar29 = self->stack;
    uVar1 = (pSVar29->heads).size;
    uVar16 = (uint)p_Var28;
    if (uVar1 <= uVar16) break;
    uVar1 = uVar16;
    if ((pSVar29->heads).contents[(ulong)p_Var28 & 0xffffffff].status != StackStatusActive) {
      uVar1 = uVar16 - 1;
      pTStack_140 = (TSParser *)0x137637;
      ts_stack_remove_version(pSVar29,uVar16);
    }
    p_Var28 = (_func_uint32_t_TSLexer_ptr *)(ulong)(uVar1 + 1);
  }
  uVar16 = (uint)pTVar30;
  if (((byte)local_12c & 6 < uVar1) == 0) {
    if (((ulong)local_138.ptr & 1) == 0) {
      uVar9 = (local_138.ptr)->symbol;
    }
    else {
      uVar9 = (ushort)local_138.data.symbol;
    }
    if (uVar9 == 0) {
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        builtin_strncpy((self->lexer).debug_buffer,"recover_eof",0xc);
        pTStack_140 = (TSParser *)0x1376e2;
        ts_parser__log(self);
      }
      local_128._0_8_ = (Subtree *)0x0;
      local_128._8_8_ = (_func_void_TSLexer_ptr__Bool *)0x0;
      pTStack_140 = (TSParser *)0x137709;
      MVar11 = ts_subtree_new_node(&self->tree_pool,0xffff,(SubtreeArray *)local_128,0,
                                   self->language);
      (MVar11.ptr)->field_0x2c = (MVar11.ptr)->field_0x2c & 0xfb;
      pTStack_140 = (TSParser *)0x137728;
      ts_stack_push(self->stack,uVar16,(Subtree)MVar11,false,1);
      pTStack_140 = (TSParser *)0x137737;
      ts_parser__accept(self,uVar16,local_138);
    }
    else {
      if (((ulong)local_138.ptr & 1) == 0) {
        uVar1 = ((Length *)((long)local_138 + 4))->bytes;
      }
      else {
        uVar1 = local_138._2_4_ & 0xff;
      }
      if (((ulong)local_138.ptr & 1) == 0) {
        uVar2 = ((Length *)((long)local_138 + 0x10))->bytes;
      }
      else {
        uVar2 = local_138._3_4_ & 0xff;
      }
      if (((ulong)local_138.ptr & 1) == 0) {
        uVar21._0_4_ = ((Length *)((long)local_138 + 4))->bytes;
        uVar21._4_4_ = (((Length *)((long)local_138 + 4))->extent).row;
        uVar22 = uVar21 & 0xffffffff;
        uVar21 = uVar21 >> 0x20;
      }
      else {
        uVar22 = (ulong)(local_138._2_4_ & 0xff);
        uVar21 = (ulong)(local_138._4_4_ >> 8 & 0xf);
      }
      uVar1 = (int)local_128._40_8_ + 100 + uVar2 + uVar1;
      local_128._40_8_ = ZEXT48(uVar1);
      if (((ulong)local_138.ptr & 1) == 0) {
        uVar18._0_4_ = ((Length *)((long)local_138 + 0x10))->bytes;
        uVar18._4_4_ = (((Length *)((long)local_138 + 0x10))->extent).row;
        uVar31 = uVar18 & 0xffffffff00000000;
        uVar17 = ((local_138.ptr)->size).extent.column;
      }
      else {
        uVar18 = (ulong)local_138.ptr >> 0x18 & 0xff;
        uVar31 = 0;
        uVar17 = (uint32_t)uVar18;
      }
      local_a0.size = uVar17;
      local_a0.contents = (Subtree *)(uVar18 & 0xffffffff | uVar31);
      SVar35 = local_a0;
      local_a0.contents._4_4_ = (int)(uVar31 >> 0x20);
      local_128._4_4_ = (undefined4)uVar21;
      iVar20 = local_128._4_4_ + local_a0.contents._4_4_;
      pTStack_140 = (TSParser *)0x137830;
      local_128._0_8_ = (Subtree *)(uVar21 << 0x20 | uVar22);
      local_a0 = SVar35;
      _Var8 = ts_parser__better_version_exists
                        (self,uVar16,(_Bool)((char)uVar1 + (char)iVar20 * '\x1e'),iVar20 * 2);
      if (_Var8) {
        if ((self->stack->heads).size <= uVar16) goto LAB_00137c48;
        pSVar12 = (self->stack->heads).contents;
        goto LAB_00137849;
      }
      if (((ulong)local_138.ptr & 1) == 0) {
        TVar10 = (local_138.ptr)->symbol;
      }
      else {
        TVar10 = (TSSymbol)local_138.data.symbol;
      }
      pool = (TSParser *)local_128;
      pTStack_140 = (TSParser *)0x1378ab;
      ts_language_table_entry(self->language,1,TVar10,(TableEntry *)pool);
      self_03 = self;
      if (((local_128._8_4_ != 0) &&
          ((*(byte *)(local_128._0_8_ + (ulong)(local_128._8_4_ - 1) * 8 + 6) & 0xf) == 0)) &&
         ((*(byte *)(local_128._0_8_ + (ulong)(local_128._8_4_ - 1) * 8 + 2) & 1) != 0)) {
        pTStack_140 = (TSParser *)0x1378d8;
        local_138 = (Subtree)ts_subtree_make_mut(&self->tree_pool,local_138);
        if (((ulong)local_138.ptr & 1) == 0) goto LAB_00137b30;
        local_138.ptr = (SubtreeHeapData *)((ulong)local_138.ptr | 8);
      }
LAB_001378ea:
      if (((self_03->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self_03->dot_graph_file != (FILE *)0x0)) {
        if (((ulong)local_138.ptr & 1) == 0) {
          uVar9 = (local_138.ptr)->symbol;
        }
        else {
          uVar9 = (ushort)local_138.data.symbol;
        }
        if (uVar9 == 0xffff) {
          pcVar19 = "ERROR";
        }
        else if (uVar9 == 0xfffe) {
          pcVar19 = "_ERROR";
        }
        else {
          pcVar19 = self_03->language->symbol_names[uVar9];
        }
        pTStack_140 = (TSParser *)0x13795e;
        snprintf((self_03->lexer).debug_buffer,0x400,"skip_token symbol:%s",pcVar19);
        pTStack_140 = (TSParser *)0x137966;
        ts_parser__log(self_03);
      }
      local_128._8_8_ = (_func_void_TSLexer_ptr__Bool *)0x0;
      local_128._0_8_ = (Subtree *)0x0;
      SVar26 = 8;
      pTStack_140 = (TSParser *)0x1379a2;
      pSVar13 = (Subtree *)calloc(1,8);
      uVar6 = local_128._8_8_;
      if (pSVar13 == (Subtree *)0x0) {
        pTStack_140 = (TSParser *)0x137c6c;
        ts_parser__recover_cold_6();
LAB_00137c6c:
        pTStack_140 = (TSParser *)0x137c74;
        ts_parser__recover_cold_5();
LAB_00137c74:
        pTStack_140 = (TSParser *)ts_parser__breakdown_top_of_stack;
        self_02 = pTVar30;
        ts_parser__recover_cold_4();
        bVar33 = false;
        pTStack_168 = pool;
        pTStack_160 = self_03;
        pTStack_158 = pTVar30;
        pTStack_150 = unaff_R14;
        MStack_148 = unaff_R15;
        pTStack_140 = unaff_RBP;
        do {
          SVar37 = ts_stack_pop_pending(self_02->stack,SVar26);
          uStack_1b0 = SVar37._8_8_;
          pSVar15 = SVar37.contents;
          if (SVar37.size != 0) {
            uVar21 = uStack_1b0 & 0xffffffff;
            uVar22 = 0;
            bVar33 = false;
            do {
              uStack_1b0 = SVar37._8_8_;
              pSVar27 = SVar37.contents;
              SVar37.size = (undefined4)uStack_1b0;
              SVar37.capacity = uStack_1b0._4_4_;
              SVar37.contents = pSVar15;
              uVar1 = pSVar27[uVar22].version;
              if ((self_02->stack->heads).size <= uVar1) {
                __assert_fail("(uint32_t)version < (&self->heads)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                              ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
              }
              uVar16 = pSVar27[uVar22].subtrees.size;
              uVar18 = (ulong)uVar16;
              if (uVar16 == 0) {
                __assert_fail("(uint32_t)0 < (&slice.subtrees)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                              ,0x8d,
                              "_Bool ts_parser__breakdown_top_of_stack(TSParser *, StackVersion)");
              }
              pSVar13 = pSVar27[uVar22].subtrees.contents;
              SVar14 = (Subtree)pSVar13->ptr;
              uVar17 = 0;
              if (((ulong)SVar14.ptr & 1) == 0) {
                uVar17 = (SVar14.ptr)->child_count;
              }
              TVar25 = ((self_02->stack->heads).contents[uVar1].node)->state;
              if (uVar17 != 0) {
                uVar31 = 0;
                do {
                  self_00 = (Subtree)((SVar14.ptr)->field_17).field_0.children[uVar31].ptr;
                  if (((ulong)self_00.ptr & 1) == 0) {
                    bVar33 = (self_00.ptr)->child_count != 0;
                  }
                  else {
                    bVar33 = false;
                  }
                  if (((ulong)self_00.ptr & 1) == 0) {
                    if ((self_00.ptr)->symbol != 0xffff) {
                      if (((ulong)self_00.ptr & 1) != 0) goto LAB_00137d8a;
                      uVar2 = *(uint *)&(self_00.ptr)->field_0x2c >> 2;
                      goto LAB_00137d8f;
                    }
LAB_00137db2:
                    TVar25 = 0;
                  }
                  else {
LAB_00137d8a:
                    uVar2 = (uint)((ulong)self_00.ptr >> 3) & 0x1fffffff;
LAB_00137d8f:
                    if ((uVar2 & 1) == 0) {
                      if (((ulong)self_00.ptr & 1) == 0) {
                        TVar10 = (self_00.ptr)->symbol;
                      }
                      else {
                        TVar10 = (TSSymbol)self_00.data.symbol;
                      }
                      if (TVar10 < 0xfffe) {
                        self_01 = self_02->language;
                        if (self_01->token_count <= (uint)TVar10) {
                          TVar25 = self_01->parse_table
                                   [(uint)TVar25 * self_01->symbol_count + (uint)TVar10];
                          goto LAB_00137db5;
                        }
                        ts_language_table_entry(self_01,TVar25,TVar10,&TStack_178);
                        if (TStack_178.action_count != 0) {
                          TVar25 = TStack_178.actions[TStack_178.action_count - 1].params.field_0.
                                   state;
                          if (((TStack_178.actions[TStack_178.action_count - 1].field_0x6 & 0xf) ==
                               0) || ((TStack_178.actions[TStack_178.action_count - 1].field_0x6 &
                                      0xf) == 3)) goto LAB_00137db5;
                        }
                      }
                      goto LAB_00137db2;
                    }
                  }
LAB_00137db5:
                  ts_subtree_retain(self_00);
                  ts_stack_push(self_02->stack,uVar1,self_00,bVar33,TVar25);
                  uVar31 = uVar31 + 1;
                } while (uVar17 != uVar31);
              }
              if (uVar16 != 1) {
                if (uVar16 < 3) {
                  uVar18 = 2;
                }
                uVar31 = 1;
                do {
                  ts_stack_push(self_02->stack,uVar1,pSVar13[uVar31],false,TVar25);
                  uVar31 = uVar31 + 1;
                } while (uVar18 != uVar31);
              }
              ts_subtree_release(&self_02->tree_pool,SVar14);
              free(pSVar13);
              if (((self_02->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (self_02->dot_graph_file != (FILE *)0x0)) {
                if (((ulong)SVar14.ptr & 1) == 0) {
                  TVar10 = (SVar14.ptr)->symbol;
                }
                else {
                  TVar10 = (TSSymbol)SVar14.data.symbol;
                }
                pcVar19 = "ERROR";
                if (TVar10 != 0xffff) {
                  if (TVar10 == 0xfffe) {
                    pcVar19 = "_ERROR";
                  }
                  else {
                    pcVar19 = self_02->language->symbol_names[TVar10];
                  }
                }
                snprintf((self_02->lexer).debug_buffer,0x400,"breakdown_top_of_stack tree:%s",
                         pcVar19);
                ts_parser__log(self_02);
              }
              if (self_02->dot_graph_file != (FILE *)0x0) {
                ts_stack_print_dot_graph(self_02->stack,self_02->language,self_02->dot_graph_file);
                fputs("\n\n",(FILE *)self_02->dot_graph_file);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar21);
          }
          if (((int)uStack_1b0 == 0) || (!bVar33)) {
            return;
          }
        } while( true );
      }
      uVar7 = local_128._8_4_;
      local_128._12_4_ = 1;
      unaff_R14 = (TSParser *)(uVar6 & 0xffffffff);
      local_128._0_8_ = pSVar13;
      if (local_128._8_4_ == 1) {
        unaff_RBP = (TSParser *)0x8;
        pool = unaff_RBP;
        if (pSVar13 == (Subtree *)0x0) {
LAB_001379fd:
          SVar26 = 8;
          pTStack_140 = (TSParser *)0x137a0a;
          pSVar13 = (Subtree *)calloc((size_t)pool,8);
          if (pSVar13 == (Subtree *)0x0) goto LAB_00137c6c;
        }
        else {
          pool = (TSParser *)0x40;
          pTStack_140 = (TSParser *)0x1379f0;
          pSVar13 = (Subtree *)realloc(pSVar13,0x40);
          if (pSVar13 == (Subtree *)0x0) {
            pTStack_140 = (TSParser *)0x1379fd;
            ts_parser__recover_cold_2();
            goto LAB_001379fd;
          }
        }
        local_128._8_8_ = (_func_void_TSLexer_ptr__Bool *)0x800000000;
        local_128._0_8_ = pSVar13;
      }
      local_128._8_4_ = uVar7 + 1;
      ((MutableSubtree *)(local_128._0_8_ + unaff_R14 * 8))->ptr = (SubtreeHeapData *)local_138;
      pool = (TSParser *)&self_03->tree_pool;
      pTStack_140 = (TSParser *)0x137a52;
      unaff_R15 = ts_subtree_new_node((SubtreePool *)pool,0xfffe,(SubtreeArray *)local_128,0,
                                      self_03->language);
      if (local_d4 == 0) goto LAB_00137b96;
      pTStack_140 = (TSParser *)0x137a75;
      SVar36 = ts_stack_pop_count(self_03->stack,(StackVersion)pTVar30,1);
      self = (TSParser *)SVar36.contents;
      unaff_R14 = self_03;
      if (((undefined1  [16])SVar36 & (undefined1  [16])0xfffffffe) != (undefined1  [16])0x0) {
        lVar32 = (ulong)SVar36.size - 1;
        pTVar30 = self;
        do {
          pTVar30 = (TSParser *)&(pTVar30->lexer).data.get_column;
          pTStack_140 = (TSParser *)0x137a9b;
          ts_subtree_array_delete((SubtreePool *)pool,(SubtreeArray *)pTVar30);
          unaff_R14 = (TSParser *)local_128._48_8_;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
        pSVar29 = *(Stack **)(local_128._48_8_ + 0x4a8);
        SVar26 = *(int *)&(self->lexer).data.mark_end + 1;
        pTVar30 = (TSParser *)(ulong)(uint)local_128._32_4_;
        if (SVar26 < (pSVar29->heads).size) {
          do {
            pTStack_140 = (TSParser *)0x137ac6;
            ts_stack_remove_version(pSVar29,SVar26);
            pSVar29 = *(Stack **)((long)unaff_R14 + 0x4a8);
            SVar26 = *(int *)&(self->lexer).data.mark_end + 1;
          } while (SVar26 < (pSVar29->heads).size);
        }
      }
      pTStack_140 = (TSParser *)0x137aed;
      ts_stack_renumber_version
                (unaff_R14->stack,*(StackVersion *)&(self->lexer).data.mark_end,
                 (StackVersion)pTVar30);
      uVar1 = *(uint32_t *)((long)&(self->lexer).data.advance + 4);
      if (*(uint *)&(self->lexer).data.advance != uVar1) goto LAB_00137b5d;
      unaff_RBP = (TSParser *)0x8;
      if (8 < uVar1 * 2) {
        unaff_RBP = (TSParser *)(ulong)(uVar1 * 2);
      }
      if ((uint)unaff_RBP <= uVar1) goto LAB_00137b5d;
      pSVar13 = *(Subtree **)&(self->lexer).data;
      if (pSVar13 != (Subtree *)0x0) {
        pTVar30 = (TSParser *)((long)unaff_RBP << 3);
        pTStack_140 = (TSParser *)0x137b23;
        pSVar13 = (Subtree *)realloc(pSVar13,(size_t)pTVar30);
        if (pSVar13 != (Subtree *)0x0) goto LAB_00137b4f;
        pTStack_140 = (TSParser *)0x137b30;
        ts_parser__recover_cold_3();
        local_138.data = extraout_RAX_00.data;
LAB_00137b30:
        (local_138.ptr)->field_0x2c = (local_138.ptr)->field_0x2c | 4;
        self_03 = self;
        goto LAB_001378ea;
      }
      SVar26 = 8;
      pTStack_140 = (TSParser *)0x137b46;
      pSVar13 = (Subtree *)calloc((size_t)unaff_RBP,8);
      self_03 = self;
      pTVar30 = unaff_RBP;
      if (pSVar13 == (Subtree *)0x0) goto LAB_00137c74;
LAB_00137b4f:
      *(Subtree **)&(self->lexer).data = pSVar13;
      *(uint *)((long)&(self->lexer).data.advance + 4) = (uint)unaff_RBP;
      pTVar30 = (TSParser *)(ulong)(uint)local_128._32_4_;
LAB_00137b5d:
      self_03 = (TSParser *)local_128._48_8_;
      pSVar13 = *(Subtree **)&(self->lexer).data;
      uVar1 = *(uint *)&(self->lexer).data.advance;
      *(uint *)&(self->lexer).data.advance = uVar1 + 1;
      *(MutableSubtree *)(pSVar13 + uVar1) = unaff_R15;
      pTStack_140 = (TSParser *)0x137b93;
      unaff_R15 = ts_subtree_new_node((SubtreePool *)pool,0xfffe,(SubtreeArray *)self,0,
                                      *(TSLanguage **)(local_128._48_8_ + 0x4d0));
LAB_00137b96:
      pTStack_140 = (TSParser *)0x137bae;
      ts_stack_push(self_03->stack,(StackVersion)pTVar30,(Subtree)unaff_R15,false,0);
      if ((((ulong)local_138.ptr & 1) == 0) && (((local_138.ptr)->field_0x2c & 0x40) != 0)) {
        pSVar29 = self_03->stack;
        pTStack_140 = (TSParser *)0x137bcb;
        SVar14 = ts_subtree_last_external_token(local_138);
        pTStack_140 = (TSParser *)0x137bd9;
        ts_stack_set_last_external_token(pSVar29,(StackVersion)pTVar30,SVar14);
      }
    }
    return;
  }
  if (uVar1 <= uVar16) {
LAB_00137c48:
    pTStack_140 = (TSParser *)0x137c67;
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x29d,"void ts_stack_halt(Stack *, StackVersion)");
  }
  pSVar12 = (pSVar29->heads).contents;
LAB_00137849:
  (&pSVar12->status)[local_b0 * 2] = StackStatusHalted;
  ts_subtree_release(&self->tree_pool,local_138);
  return;
}

Assistant:

static void ts_parser__recover(TSParser *self, StackVersion version, Subtree lookahead) {
  bool did_recover = false;
  unsigned previous_version_count = ts_stack_version_count(self->stack);
  Length position = ts_stack_position(self->stack, version);
  StackSummary *summary = ts_stack_get_summary(self->stack, version);
  unsigned node_count_since_error = ts_stack_node_count_since_error(self->stack, version);
  unsigned current_error_cost = ts_stack_error_cost(self->stack, version);

  // When the parser is in the error state, there are two strategies for recovering with a
  // given lookahead token:
  // 1. Find a previous state on the stack in which that lookahead token would be valid. Then,
  //    create a new stack version that is in that state again. This entails popping all of the
  //    subtrees that have been pushed onto the stack since that previous state, and wrapping
  //    them in an ERROR node.
  // 2. Wrap the lookahead token in an ERROR node, push that ERROR node onto the stack, and
  //    move on to the next lookahead token, remaining in the error state.
  //
  // First, try the strategy 1. Upon entering the error state, the parser recorded a summary
  // of the previous parse states and their depths. Look at each state in the summary, to see
  // if the current lookahead token would be valid in that state.
  if (summary && !ts_subtree_is_error(lookahead)) {
    for (unsigned i = 0; i < summary->size; i++) {
      StackSummaryEntry entry = summary->contents[i];

      if (entry.state == ERROR_STATE) continue;
      if (entry.position.bytes == position.bytes) continue;
      unsigned depth = entry.depth;
      if (node_count_since_error > 0) depth++;

      // Do not recover in ways that create redundant stack versions.
      bool would_merge = false;
      for (unsigned j = 0; j < previous_version_count; j++) {
        if (
          ts_stack_state(self->stack, j) == entry.state &&
          ts_stack_position(self->stack, j).bytes == position.bytes
        ) {
          would_merge = true;
          break;
        }
      }
      if (would_merge) continue;

      // Do not recover if the result would clearly be worse than some existing stack version.
      unsigned new_cost =
        current_error_cost +
        entry.depth * ERROR_COST_PER_SKIPPED_TREE +
        (position.bytes - entry.position.bytes) * ERROR_COST_PER_SKIPPED_CHAR +
        (position.extent.row - entry.position.extent.row) * ERROR_COST_PER_SKIPPED_LINE;
      if (ts_parser__better_version_exists(self, version, false, new_cost)) break;

      // If the current lookahead token is valid in some previous state, recover to that state.
      // Then stop looking for further recoveries.
      if (ts_language_has_actions(self->language, entry.state, ts_subtree_symbol(lookahead))) {
        if (ts_parser__recover_to_state(self, version, depth, entry.state)) {
          did_recover = true;
          LOG("recover_to_previous state:%u, depth:%u", entry.state, depth);
          LOG_STACK();
          break;
        }
      }
    }
  }

  // In the process of attemping to recover, some stack versions may have been created
  // and subsequently halted. Remove those versions.
  for (unsigned i = previous_version_count; i < ts_stack_version_count(self->stack); i++) {
    if (!ts_stack_is_active(self->stack, i)) {
      ts_stack_remove_version(self->stack, i--);
    }
  }

  // If strategy 1 succeeded, a new stack version will have been created which is able to handle
  // the current lookahead token. Now, in addition, try strategy 2 described above: skip the
  // current lookahead token by wrapping it in an ERROR node.

  // Don't pursue this additional strategy if there are already too many stack versions.
  if (did_recover && ts_stack_version_count(self->stack) > MAX_VERSION_COUNT) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the parser is still in the error state at the end of the file, just wrap everything
  // in an ERROR node and terminate.
  if (ts_subtree_is_eof(lookahead)) {
    LOG("recover_eof");
    SubtreeArray children = array_new();
    Subtree parent = ts_subtree_new_error_node(&self->tree_pool, &children, false, self->language);
    ts_stack_push(self->stack, version, parent, false, 1);
    ts_parser__accept(self, version, lookahead);
    return;
  }

  // Do not recover if the result would clearly be worse than some existing stack version.
  unsigned new_cost =
    current_error_cost + ERROR_COST_PER_SKIPPED_TREE +
    ts_subtree_total_bytes(lookahead) * ERROR_COST_PER_SKIPPED_CHAR +
    ts_subtree_total_size(lookahead).extent.row * ERROR_COST_PER_SKIPPED_LINE;
  if (ts_parser__better_version_exists(self, version, false, new_cost)) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the current lookahead token is an extra token, mark it as extra. This means it won't
  // be counted in error cost calculations.
  unsigned n;
  const TSParseAction *actions = ts_language_actions(self->language, 1, ts_subtree_symbol(lookahead), &n);
  if (n > 0 && actions[n - 1].type == TSParseActionTypeShift && actions[n - 1].params.extra) {
    MutableSubtree mutable_lookahead = ts_subtree_make_mut(&self->tree_pool, lookahead);
    ts_subtree_set_extra(&mutable_lookahead);
    lookahead = ts_subtree_from_mut(mutable_lookahead);
  }

  // Wrap the lookahead token in an ERROR.
  LOG("skip_token symbol:%s", TREE_NAME(lookahead));
  SubtreeArray children = array_new();
  array_reserve(&children, 1);
  array_push(&children, lookahead);
  MutableSubtree error_repeat = ts_subtree_new_node(
    &self->tree_pool,
    ts_builtin_sym_error_repeat,
    &children,
    0,
    self->language
  );

  // If other tokens have already been skipped, so there is already an ERROR at the top of the
  // stack, then pop that ERROR off the stack and wrap the two ERRORs together into one larger
  // ERROR.
  if (node_count_since_error > 0) {
    StackSliceArray pop = ts_stack_pop_count(self->stack, version, 1);

    // TODO: Figure out how to make this condition occur.
    // See https://github.com/atom/atom/issues/18450#issuecomment-439579778
    // If multiple stack versions have merged at this point, just pick one of the errors
    // arbitrarily and discard the rest.
    if (pop.size > 1) {
      for (unsigned i = 1; i < pop.size; i++) {
        ts_subtree_array_delete(&self->tree_pool, &pop.contents[i].subtrees);
      }
      while (ts_stack_version_count(self->stack) > pop.contents[0].version + 1) {
        ts_stack_remove_version(self->stack, pop.contents[0].version + 1);
      }
    }

    ts_stack_renumber_version(self->stack, pop.contents[0].version, version);
    array_push(&pop.contents[0].subtrees, ts_subtree_from_mut(error_repeat));
    error_repeat = ts_subtree_new_node(
      &self->tree_pool,
      ts_builtin_sym_error_repeat,
      &pop.contents[0].subtrees,
      0,
      self->language
    );
  }

  // Push the new ERROR onto the stack.
  ts_stack_push(self->stack, version, ts_subtree_from_mut(error_repeat), false, ERROR_STATE);
  if (ts_subtree_has_external_tokens(lookahead)) {
    ts_stack_set_last_external_token(
      self->stack, version, ts_subtree_last_external_token(lookahead)
    );
  }
}